

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTime.c
# Opt level: O2

char * strtimeex_m(void)

{
  int iVar1;
  tm *__tp;
  size_t sVar2;
  char sztmp [4];
  time_t tt;
  timeval local_18;
  
  strftimeex_m_tmpbuf[0] = '\0';
  strftimeex_m_tmpbuf[1] = '\0';
  strftimeex_m_tmpbuf[2] = '\0';
  strftimeex_m_tmpbuf[3] = '\0';
  strftimeex_m_tmpbuf[4] = '\0';
  strftimeex_m_tmpbuf[5] = '\0';
  strftimeex_m_tmpbuf[6] = '\0';
  strftimeex_m_tmpbuf[7] = '\0';
  strftimeex_m_tmpbuf[8] = '\0';
  strftimeex_m_tmpbuf[9] = '\0';
  strftimeex_m_tmpbuf[10] = '\0';
  strftimeex_m_tmpbuf[0xb] = '\0';
  strftimeex_m_tmpbuf[0xc] = '\0';
  strftimeex_m_tmpbuf[0xd] = '\0';
  strftimeex_m_tmpbuf[0xe] = '\0';
  strftimeex_m_tmpbuf[0xf] = '\0';
  strftimeex_m_tmpbuf[0x10] = '\0';
  strftimeex_m_tmpbuf[0x11] = '\0';
  strftimeex_m_tmpbuf[0x12] = '\0';
  strftimeex_m_tmpbuf[0x13] = '\0';
  strftimeex_m_tmpbuf[0x14] = '\0';
  strftimeex_m_tmpbuf[0x15] = '\0';
  strftimeex_m_tmpbuf[0x16] = '\0';
  strftimeex_m_tmpbuf[0x17] = '\0';
  strftimeex_m_tmpbuf[0x18] = '\0';
  strftimeex_m_tmpbuf[0x19] = '\0';
  strftimeex_m_tmpbuf[0x1a] = '\0';
  strftimeex_m_tmpbuf[0x1b] = '\0';
  strftimeex_m_tmpbuf[0x1c] = '\0';
  strftimeex_m_tmpbuf[0x1d] = '\0';
  strftimeex_m_tmpbuf[0x1e] = '\0';
  strftimeex_m_tmpbuf[0x1f] = '\0';
  strftimeex_m_tmpbuf[0x20] = '\0';
  strftimeex_m_tmpbuf[0x21] = '\0';
  strftimeex_m_tmpbuf[0x22] = '\0';
  strftimeex_m_tmpbuf[0x23] = '\0';
  strftimeex_m_tmpbuf[0x24] = '\0';
  strftimeex_m_tmpbuf[0x25] = '\0';
  strftimeex_m_tmpbuf[0x26] = '\0';
  strftimeex_m_tmpbuf[0x27] = '\0';
  strftimeex_m_tmpbuf[0x28] = '\0';
  strftimeex_m_tmpbuf[0x29] = '\0';
  strftimeex_m_tmpbuf[0x2a] = '\0';
  strftimeex_m_tmpbuf[0x2b] = '\0';
  strftimeex_m_tmpbuf[0x2c] = '\0';
  strftimeex_m_tmpbuf[0x2d] = '\0';
  strftimeex_m_tmpbuf[0x2e] = '\0';
  strftimeex_m_tmpbuf[0x2f] = '\0';
  strftimeex_m_tmpbuf[0x30] = '\0';
  strftimeex_m_tmpbuf[0x31] = '\0';
  strftimeex_m_tmpbuf[0x32] = '\0';
  strftimeex_m_tmpbuf[0x33] = '\0';
  strftimeex_m_tmpbuf[0x34] = '\0';
  strftimeex_m_tmpbuf[0x35] = '\0';
  strftimeex_m_tmpbuf[0x36] = '\0';
  strftimeex_m_tmpbuf[0x37] = '\0';
  strftimeex_m_tmpbuf[0x38] = '\0';
  strftimeex_m_tmpbuf[0x39] = '\0';
  strftimeex_m_tmpbuf[0x3a] = '\0';
  strftimeex_m_tmpbuf[0x3b] = '\0';
  strftimeex_m_tmpbuf[0x3c] = '\0';
  strftimeex_m_tmpbuf[0x3d] = '\0';
  strftimeex_m_tmpbuf[0x3e] = '\0';
  strftimeex_m_tmpbuf[0x3f] = '\0';
  iVar1 = gettimeofday(&local_18,(__timezone_ptr_t)0x0);
  if (iVar1 == 0) {
    tt = local_18.tv_sec;
  }
  else {
    local_18.tv_sec = 0;
    local_18.tv_usec = 0;
    time(&tt);
  }
  __tp = localtime(&tt);
  if (__tp != (tm *)0x0) {
    sVar2 = strftime(strftimeex_m_tmpbuf,0x40,"%Y-%m-%d %H:%M:%S",__tp);
    if (sVar2 == 0) {
      strftimeex_m_tmpbuf[0x30] = '\0';
      strftimeex_m_tmpbuf[0x31] = '\0';
      strftimeex_m_tmpbuf[0x32] = '\0';
      strftimeex_m_tmpbuf[0x33] = '\0';
      strftimeex_m_tmpbuf[0x34] = '\0';
      strftimeex_m_tmpbuf[0x35] = '\0';
      strftimeex_m_tmpbuf[0x36] = '\0';
      strftimeex_m_tmpbuf[0x37] = '\0';
      strftimeex_m_tmpbuf[0x38] = '\0';
      strftimeex_m_tmpbuf[0x39] = '\0';
      strftimeex_m_tmpbuf[0x3a] = '\0';
      strftimeex_m_tmpbuf[0x3b] = '\0';
      strftimeex_m_tmpbuf[0x3c] = '\0';
      strftimeex_m_tmpbuf[0x3d] = '\0';
      strftimeex_m_tmpbuf[0x3e] = '\0';
      strftimeex_m_tmpbuf[0x3f] = '\0';
      strftimeex_m_tmpbuf[0x20] = '\0';
      strftimeex_m_tmpbuf[0x21] = '\0';
      strftimeex_m_tmpbuf[0x22] = '\0';
      strftimeex_m_tmpbuf[0x23] = '\0';
      strftimeex_m_tmpbuf[0x24] = '\0';
      strftimeex_m_tmpbuf[0x25] = '\0';
      strftimeex_m_tmpbuf[0x26] = '\0';
      strftimeex_m_tmpbuf[0x27] = '\0';
      strftimeex_m_tmpbuf[0x28] = '\0';
      strftimeex_m_tmpbuf[0x29] = '\0';
      strftimeex_m_tmpbuf[0x2a] = '\0';
      strftimeex_m_tmpbuf[0x2b] = '\0';
      strftimeex_m_tmpbuf[0x2c] = '\0';
      strftimeex_m_tmpbuf[0x2d] = '\0';
      strftimeex_m_tmpbuf[0x2e] = '\0';
      strftimeex_m_tmpbuf[0x2f] = '\0';
      strftimeex_m_tmpbuf[0x10] = '\0';
      strftimeex_m_tmpbuf[0x11] = '\0';
      strftimeex_m_tmpbuf[0x12] = '\0';
      strftimeex_m_tmpbuf[0x13] = '\0';
      strftimeex_m_tmpbuf[0x14] = '\0';
      strftimeex_m_tmpbuf[0x15] = '\0';
      strftimeex_m_tmpbuf[0x16] = '\0';
      strftimeex_m_tmpbuf[0x17] = '\0';
      strftimeex_m_tmpbuf[0x18] = '\0';
      strftimeex_m_tmpbuf[0x19] = '\0';
      strftimeex_m_tmpbuf[0x1a] = '\0';
      strftimeex_m_tmpbuf[0x1b] = '\0';
      strftimeex_m_tmpbuf[0x1c] = '\0';
      strftimeex_m_tmpbuf[0x1d] = '\0';
      strftimeex_m_tmpbuf[0x1e] = '\0';
      strftimeex_m_tmpbuf[0x1f] = '\0';
      strftimeex_m_tmpbuf[0] = '\0';
      strftimeex_m_tmpbuf[1] = '\0';
      strftimeex_m_tmpbuf[2] = '\0';
      strftimeex_m_tmpbuf[3] = '\0';
      strftimeex_m_tmpbuf[4] = '\0';
      strftimeex_m_tmpbuf[5] = '\0';
      strftimeex_m_tmpbuf[6] = '\0';
      strftimeex_m_tmpbuf[7] = '\0';
      strftimeex_m_tmpbuf[8] = '\0';
      strftimeex_m_tmpbuf[9] = '\0';
      strftimeex_m_tmpbuf[10] = '\0';
      strftimeex_m_tmpbuf[0xb] = '\0';
      strftimeex_m_tmpbuf[0xc] = '\0';
      strftimeex_m_tmpbuf[0xd] = '\0';
      strftimeex_m_tmpbuf[0xe] = '\0';
      strftimeex_m_tmpbuf[0xf] = '\0';
    }
    else {
      iVar1 = snprintf(sztmp,4,":%02d",local_18.tv_usec / 10000 & 0xffffffff);
      if (iVar1 != 3) {
        builtin_strncpy(sztmp,":00",4);
      }
      strcat(strftimeex_fns_tmpbuf,sztmp);
    }
  }
  return strftimeex_m_tmpbuf;
}

Assistant:

char* strtimeex_m(void)
{
	char sztmp[4];
	struct timeval tv;
#ifndef WINCE
	time_t tt;
	struct tm *timeptr = NULL;

	memset(strftimeex_m_tmpbuf, 0, sizeof(strftimeex_m_tmpbuf));

	if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; time(&tt); }
	else { tt = tv.tv_sec; }
	timeptr = localtime(&tt);

	if (timeptr == NULL)
	{
		return strftimeex_m_tmpbuf;
	}

	// Use strftime to build a customized time string. 
	if (strftime(
		strftimeex_m_tmpbuf,
		sizeof(strftimeex_m_tmpbuf),
		"%Y-%m-%d %H:%M:%S",
		timeptr
	) <= 0)
	{
		memset(strftimeex_m_tmpbuf, 0, sizeof(strftimeex_m_tmpbuf));
		return strftimeex_m_tmpbuf;
	}
#else
	int nb = 0;
	TCHAR* tstr = (TCHAR*)calloc(sizeof(strftimeex_m_tmpbuf), sizeof(TCHAR));

	memset(strftimeex_m_tmpbuf, 0, sizeof(strftimeex_m_tmpbuf));

	if (tstr == NULL)
	{
		return strftimeex_m_tmpbuf;
	}

	memset(tstr, 0, sizeof(strftimeex_m_tmpbuf)*sizeof(TCHAR));

	// Use GetDateFormat() and GetTimeFormat() to build a customized time string. 
	nb = GetDateFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system date.
		_T("yyyy'-'MM'-'dd' '"), // Format the string. 
		tstr,
		sizeof(strftimeex_m_tmpbuf)
	);
	if (nb <= 0)
	{
		free(tstr); tstr = NULL;
		return strftimeex_m_tmpbuf;
	}

	if (GetTimeFormat(
		MAKELCID(MAKELANGID(LANG_ENGLISH, SUBLANG_ENGLISH_US), SORT_DEFAULT), // Locale.
		0, // Flags.
		NULL, // Current local system time.
		_T("HH':'mm':'ss"), // Format the string. 
		tstr+(nb-1),
		sizeof(strftimeex_m_tmpbuf)-(nb-1)
	) <= 0)
	{
		free(tstr); tstr = NULL;
		return strftimeex_m_tmpbuf;
	}

	if (gettimeofday(&tv, NULL) != EXIT_SUCCESS) { tv.tv_sec = 0; tv.tv_usec = 0; }

#ifdef UNICODE
	wcstombs(strftimeex_m_tmpbuf, tstr, sizeof(strftimeex_m_tmpbuf));
#else
	memcpy(strftimeex_m_tmpbuf, tstr, sizeof(strftimeex_m_tmpbuf));
#endif // UNICODE
	strftimeex_m_tmpbuf[sizeof(strftimeex_m_tmpbuf)-sizeof(sztmp)-1] = 0;
	free(tstr); tstr = NULL;
#endif // !WINCE

#ifndef DISABLE_USE_SNPRINTF
	if (snprintf(sztmp, sizeof(sztmp), ":%02d", (int)(tv.tv_usec/10000)) != 3)
#else
	if (sprintf(sztmp, ":%02d", (int)(tv.tv_usec/10000)) != 3)
#endif // DISABLE_USE_SNPRINTF
	{
		strcpy(sztmp, ":00");
	}
	strcat(strftimeex_fns_tmpbuf, sztmp);

	return strftimeex_m_tmpbuf;
}